

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::JobManager::PrepareStartJobs
          (Error *__return_storage_ptr__,JobManager *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids,bool aGroupAlias)

{
  uint64_t uVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  bool bVar2;
  uint uVar3;
  const_reference aStr;
  size_type sVar4;
  string *psVar5;
  mapped_type *this_01;
  pointer ppVar6;
  element_type *peVar7;
  Error *pEVar8;
  ErrorCode local_4cc;
  Error local_4c8;
  undefined1 local_499;
  undefined1 local_498 [7];
  bool condition_2;
  undefined1 local_478 [8];
  Expression expr;
  Error local_458;
  allocator local_429;
  string local_428;
  byte local_401;
  iterator iStack_400;
  bool active;
  ErrorCode local_3f4;
  Error local_3f0;
  undefined1 local_3c8 [8];
  CommissionerAppPtr commissioner;
  _Self local_3b0;
  iterator entry;
  Error local_3a0;
  string local_378;
  Error local_358;
  Error local_330;
  undefined1 local_308 [8];
  Config conf;
  BorderRouter br;
  unsigned_long *nid;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  bool condition_1;
  string local_50;
  undefined1 local_2b;
  byte local_2a;
  byte local_29;
  bool condition;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvStack_28;
  bool aGroupAlias_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids_local;
  Expression *aExpr_local;
  JobManager *this_local;
  Error *error;
  
  local_2a = 0;
  local_29 = aGroupAlias;
  pvStack_28 = aNids;
  aNids_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)aExpr;
  aExpr_local = (Expression *)this;
  this_local = (JobManager *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  aStr = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)aNids_local,0);
  utils::ToLower(&local_50,aStr);
  bVar2 = std::operator==(&local_50,"start");
  std::__cxx11::string::~string((string *)&local_50);
  local_2b = bVar2;
  if (!bVar2) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                  ,0xca,
                  "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                 );
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)aNids_local);
  this_00 = pvStack_28;
  if (sVar4 != 1) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                  ,0xd0,
                  "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                 );
  }
  __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvStack_28);
  nid = (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&nid);
    if (!bVar2) {
LAB_003b24a0:
      local_2a = 1;
      entry._M_node._4_4_ = 1;
LAB_003b24ae:
      if ((local_2a & 1) == 0) {
        Error::~Error(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    br.mAgent._368_8_ =
         __gnu_cxx::
         __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator*(&__end2);
    persistent_storage::BorderRouter::BorderRouter
              ((BorderRouter *)((long)&conf.mThreadSMRoot.field_2 + 8));
    Config::Config((Config *)local_308,&this->mDefaultConf);
    PrepareDtlsConfig(&local_330,this,*(uint64_t *)br.mAgent._368_8_,(Config *)local_308);
    Error::operator=(__return_storage_ptr__,&local_330);
    Error::~Error(&local_330);
    Error::Error(&local_358);
    bVar2 = Error::operator!=(__return_storage_ptr__,&local_358);
    Error::~Error(&local_358);
    if (bVar2) {
      uVar1 = *(uint64_t *)br.mAgent._368_8_;
      psVar5 = Error::GetMessage_abi_cxx11_(__return_storage_ptr__);
      std::__cxx11::string::string((string *)&local_378,(string *)psVar5);
      ErrorMsg(this,uVar1,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      Error::Error(&local_3a0);
      Error::operator=(__return_storage_ptr__,&local_3a0);
      Error::~Error(&local_3a0);
      entry._M_node._4_4_ = 7;
    }
    else {
      local_3b0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
           ::find(&this->mCommissionerPool,(key_type_conflict *)br.mAgent._368_8_);
      commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
           ::end(&this->mCommissionerPool);
      bVar2 = std::operator==(&local_3b0,
                              (_Self *)&commissioner.
                                        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
      if (bVar2) {
        std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
                  ((shared_ptr<ot::commissioner::CommissionerApp> *)local_3c8);
        CommissionerAppCreate
                  (&local_3f0,(shared_ptr<ot::commissioner::CommissionerApp> *)local_3c8,
                   (Config *)local_308);
        pEVar8 = Error::operator=(__return_storage_ptr__,&local_3f0);
        local_3f4 = kNone;
        bVar2 = commissioner::operator!=(pEVar8,&local_3f4);
        Error::~Error(&local_3f0);
        if (bVar2) {
          entry._M_node._4_4_ = 10;
        }
        else {
          this_01 = std::
                    map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                    ::operator[](&this->mCommissionerPool,(key_type_conflict *)br.mAgent._368_8_);
          std::shared_ptr<ot::commissioner::CommissionerApp>::operator=
                    (this_01,(shared_ptr<ot::commissioner::CommissionerApp> *)local_3c8);
          iStack_400 = std::
                       map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                       ::find(&this->mCommissionerPool,(key_type_conflict *)br.mAgent._368_8_);
          entry._M_node._4_4_ = 0;
          local_3b0._M_node = iStack_400._M_node;
        }
        std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
                  ((shared_ptr<ot::commissioner::CommissionerApp> *)local_3c8);
        if (entry._M_node._4_4_ != 0) goto LAB_003b2424;
      }
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>
               ::operator->(&local_3b0);
      peVar7 = std::
               __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ppVar6->second);
      uVar3 = (*(peVar7->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
      local_401 = (byte)uVar3 & 1;
      if ((uVar3 & 1) == 0) {
        MakeBorderRouterChoice
                  (&local_458,this,*(uint64_t *)br.mAgent._368_8_,
                   (BorderRouter *)((long)&conf.mThreadSMRoot.field_2 + 8));
        pEVar8 = Error::operator=(__return_storage_ptr__,&local_458);
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        bVar2 = commissioner::operator!=
                          (pEVar8,(ErrorCode *)
                                  ((long)&expr.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        Error::~Error(&local_458);
        if (bVar2) {
          entry._M_node._4_4_ = 10;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_478,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)aNids_local);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_478,(value_type *)&br.mAgent);
          std::__cxx11::to_string((string *)local_498,(uint)(ushort)br.mAgent.mAddr.field_2._8_2_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_478,(value_type *)local_498);
          std::__cxx11::string::~string((string *)local_498);
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_478);
          local_499 = sVar4 == 3;
          if (!(bool)local_499) {
            __assert_fail("condition",
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                          ,0xf7,
                          "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                         );
          }
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>
                   ::operator->(&local_3b0);
          CreateJob(&local_4c8,this,&ppVar6->second,(Expression *)local_478,
                    *(uint64_t *)br.mAgent._368_8_);
          pEVar8 = Error::operator=(__return_storage_ptr__,&local_4c8);
          local_4cc = kNone;
          bVar2 = commissioner::operator!=(pEVar8,&local_4cc);
          Error::~Error(&local_4c8);
          if (bVar2) {
            entry._M_node._4_4_ = 10;
          }
          else {
            entry._M_node._4_4_ = 0;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_478);
          if (entry._M_node._4_4_ == 0) {
            entry._M_node._4_4_ = 0;
          }
        }
      }
      else {
        if ((local_29 & 1) == 0) {
          uVar1 = *(uint64_t *)br.mAgent._368_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_428,"already started",&local_429);
          InfoMsg(this,uVar1,&local_428);
          std::__cxx11::string::~string((string *)&local_428);
          std::allocator<char>::~allocator((allocator<char> *)&local_429);
        }
        entry._M_node._4_4_ = 7;
      }
    }
LAB_003b2424:
    Config::~Config((Config *)local_308);
    persistent_storage::BorderRouter::~BorderRouter
              ((BorderRouter *)((long)&conf.mThreadSMRoot.field_2 + 8));
    if ((entry._M_node._4_4_ != 0) && (entry._M_node._4_4_ != 7)) {
      if (entry._M_node._4_4_ != 10) goto LAB_003b24ae;
      goto LAB_003b24a0;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Error JobManager::PrepareStartJobs(const Interpreter::Expression &aExpr,
                                   const std::vector<uint64_t>   &aNids,
                                   bool                           aGroupAlias)
{
    Error error = ERROR_NONE;

    ASSERT(utils::ToLower(aExpr[0]) == "start");
    /*
     * Coming here is a result of using multi-network syntax.
     * Therefore, no extra arguments to be used, otherwise it
     * is multi-network syntax violation.
     */
    ASSERT(aExpr.size() == 1);

    for (const auto &nid : aNids)
    {
        BorderRouter br;
        Config       conf = mDefaultConf;

        error = PrepareDtlsConfig(nid, conf);
        if (error != ERROR_NONE)
        {
            ErrorMsg(nid, error.GetMessage());
            error = ERROR_NONE;
            continue;
        }
        {
            auto entry = mCommissionerPool.find(nid);
            if (entry == mCommissionerPool.end())
            {
                CommissionerAppPtr commissioner;

                SuccessOrExit(error = CommissionerAppCreate(commissioner, conf));
                mCommissionerPool[nid] = commissioner;
                entry                  = mCommissionerPool.find(nid);
            }

            bool active = entry->second->IsActive();
            if (active)
            {
                if (!aGroupAlias)
                {
                    InfoMsg(nid, "already started");
                }
                continue;
            }

            SuccessOrExit(error = MakeBorderRouterChoice(nid, br));
            auto expr = aExpr;
            expr.push_back(br.mAgent.mAddr);
            expr.push_back(std::to_string(br.mAgent.mPort));
            ASSERT(expr.size() == 3); // 'start br_addr br_port'
            SuccessOrExit(error = CreateJob(entry->second, expr, nid));
        }
    }
exit:
    return error;
}